

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestUtil::Texture2DShader::Texture2DShader
          (Texture2DShader *this,DataTypes *samplerTypes,DataType outputType,Vec4 *outScale,
          Vec4 *outBias)

{
  vector<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
  *this_00;
  undefined8 *puVar1;
  GenericVecType GVar2;
  pointer pIVar3;
  Texture2DShader *pTVar4;
  ostream *poVar5;
  char *pcVar6;
  int inNdx;
  int iVar7;
  int ndx;
  int samplerNdx;
  long lVar8;
  long lVar9;
  allocator<char> local_341;
  DataTypes *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  ulong local_318;
  Texture2DShader *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  Vec4 *local_2e8;
  Vec4 *local_2e0;
  string local_2d8;
  undefined1 local_2b8 [8];
  size_type sStack_2b0;
  GenericVecType local_298;
  ShaderProgramDeclaration local_140;
  
  local_340 = samplerTypes;
  local_310 = this;
  local_2e8 = outScale;
  local_2e0 = outBias;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"a_position",(allocator<char> *)&local_308);
  std::__cxx11::string::string((string *)local_2b8,(string *)&local_338);
  local_298 = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(VertexAttribute *)local_2b8);
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"a_coord",(allocator<char> *)&local_308);
  std::__cxx11::string::string((string *)local_2b8,(string *)&local_338);
  local_298 = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(VertexAttribute *)local_2b8);
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)&local_338);
  local_2b8._0_4_ = GENERICVECTYPE_FLOAT;
  local_2b8._4_4_ = local_2b8._4_4_ & 0xffffff00;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(VertexToFragmentVarying *)local_2b8);
  if (outputType == TYPE_FLOAT_VEC4) {
    local_2b8._0_4_ = GENERICVECTYPE_FLOAT;
  }
  else if (outputType == TYPE_UINT_VEC4) {
    local_2b8._0_4_ = GENERICVECTYPE_UINT32;
  }
  else if (outputType == TYPE_INT_VEC4) {
    local_2b8._0_4_ = GENERICVECTYPE_INT32;
  }
  else {
    local_2b8._0_4_ = GENERICVECTYPE_LAST;
  }
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(FragmentOutput *)local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main(void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,(allocator<char> *)&local_308);
  std::__cxx11::string::string((string *)local_2b8,(string *)&local_338);
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(VertexSource *)local_2b8);
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
  poVar5 = std::operator<<((ostream *)local_2b8,"#version 300 es\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) out highp ");
  pcVar6 = glu::getDataTypeName(outputType);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::operator<<(poVar5," o_color0;\n");
  std::operator<<((ostream *)local_2b8,"in highp vec2 v_coord;\n");
  for (lVar8 = 0;
      lVar8 < (int)((ulong)((long)(local_340->vec).
                                  super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_340->vec).
                                 super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2); lVar8 = lVar8 + 1)
  {
    poVar5 = std::operator<<((ostream *)local_2b8,"uniform ");
    poVar5 = std::operator<<(poVar5,"highp");
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = glu::getDataTypeName
                       ((local_340->vec).
                        super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar8]);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5," u_sampler");
    iVar7 = (int)lVar8;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
    std::operator<<(poVar5,";\n");
    poVar5 = std::operator<<((ostream *)local_2b8,"uniform ");
    poVar5 = std::operator<<(poVar5,"highp");
    poVar5 = std::operator<<(poVar5," vec4 u_texScale");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
    std::operator<<(poVar5,";\n");
    poVar5 = std::operator<<((ostream *)local_2b8,"uniform ");
    poVar5 = std::operator<<(poVar5,"highp");
    poVar5 = std::operator<<(poVar5," vec4 u_texBias");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
    std::operator<<(poVar5,";\n");
  }
  poVar5 = std::operator<<((ostream *)local_2b8,"uniform ");
  poVar5 = std::operator<<(poVar5,"highp");
  poVar5 = std::operator<<(poVar5," vec4 u_outScale0;\n");
  poVar5 = std::operator<<(poVar5,"uniform ");
  poVar5 = std::operator<<(poVar5,"highp");
  std::operator<<(poVar5," vec4 u_outBias0;\n");
  poVar5 = std::operator<<((ostream *)local_2b8,"\n");
  poVar5 = std::operator<<(poVar5,"void main (void)\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"\t");
  poVar5 = std::operator<<(poVar5,"highp");
  std::operator<<(poVar5," vec4 out0 = vec4(0.0);\n");
  for (iVar7 = 0;
      iVar7 < (int)((ulong)((long)(local_340->vec).
                                  super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_340->vec).
                                 super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2); iVar7 = iVar7 + 1)
  {
    poVar5 = std::operator<<((ostream *)local_2b8,"\tout0 += vec4(");
    poVar5 = std::operator<<(poVar5,"texture(u_sampler");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
    poVar5 = std::operator<<(poVar5,", v_coord)) * u_texScale");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
    poVar5 = std::operator<<(poVar5," + u_texBias");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
    std::operator<<(poVar5,";\n");
  }
  poVar5 = std::operator<<((ostream *)local_2b8,"\to_color0 = ");
  pcVar6 = glu::getDataTypeName(outputType);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::operator<<(poVar5,"(out0 * u_outScale0 + u_outBias0);\n");
  std::operator<<((ostream *)local_2b8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
  std::__cxx11::string::string((string *)&local_338,(string *)&local_308);
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(FragmentSource *)&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"u_outScale0",(allocator<char> *)&local_308);
  std::__cxx11::string::string((string *)local_2b8,(string *)&local_338);
  local_298 = 4;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(Uniform *)local_2b8);
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"u_outBias0",(allocator<char> *)&local_308);
  std::__cxx11::string::string((string *)local_2b8,(string *)&local_338);
  local_298 = 4;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(Uniform *)local_2b8);
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)&local_338);
  for (local_318 = 0; pTVar4 = local_310,
      local_318 <
      (ulong)((long)(local_340->vec).
                    super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(local_340->vec).
                    super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2); local_318 = local_318 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"u_sampler",&local_341);
    de::toString<unsigned_long>(&local_2d8,&local_318);
    std::operator+(&local_338,&local_308,&local_2d8);
    GVar2 = (local_340->vec).super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
            _M_impl.super__Vector_impl_data._M_start[local_318];
    std::__cxx11::string::string((string *)local_2b8,(string *)&local_338);
    local_298 = GVar2;
    sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(Uniform *)local_2b8);
    std::__cxx11::string::~string((string *)local_2b8);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"u_texScale",&local_341)
    ;
    de::toString<unsigned_long>(&local_2d8,&local_318);
    std::operator+(&local_338,&local_308,&local_2d8);
    std::__cxx11::string::string((string *)local_2b8,(string *)&local_338);
    local_298 = 4;
    sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(Uniform *)local_2b8);
    std::__cxx11::string::~string((string *)local_2b8);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"u_texBias",&local_341);
    de::toString<unsigned_long>(&local_2d8,&local_318);
    std::operator+(&local_338,&local_308,&local_2d8);
    std::__cxx11::string::string((string *)local_2b8,(string *)&local_338);
    local_298 = 4;
    sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(Uniform *)local_2b8);
    std::__cxx11::string::~string((string *)local_2b8);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_308);
  }
  sglr::ShaderProgram::ShaderProgram(&local_310->super_ShaderProgram,&local_140);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (pTVar4->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e3d070;
  (pTVar4->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e3d0a8;
  (pTVar4->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e3d0c0;
  this_00 = &pTVar4->m_inputs;
  (pTVar4->m_inputs).
  super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar4->m_inputs).
  super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar4->m_inputs).
  super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tcu::Vector<float,_4>::Vector(&pTVar4->m_outScale,local_2e8);
  tcu::Vector<float,_4>::Vector(&pTVar4->m_outBias,local_2e0);
  pTVar4->m_outputType = outputType;
  std::
  vector<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
  ::resize(this_00,(long)(local_340->vec).
                         super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(local_340->vec).
                         super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
  lVar9 = 0;
  for (lVar8 = 0;
      pIVar3 = (local_310->m_inputs).
               super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar8 < (int)(((long)(local_310->m_inputs).
                           super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3) / 0x24);
      lVar8 = lVar8 + 1) {
    *(int *)((long)(pIVar3->scale).m_data + lVar9 + -4) = (int)lVar8;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_2b8,1.0);
    puVar1 = (undefined8 *)
             ((long)(((this_00->
                      super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                      )._M_impl.super__Vector_impl_data._M_start)->scale).m_data + lVar9);
    *puVar1 = CONCAT44(local_2b8._4_4_,local_2b8._0_4_);
    puVar1[1] = sStack_2b0;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_2b8,0.0);
    puVar1 = (undefined8 *)
             ((long)(((this_00->
                      super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                      )._M_impl.super__Vector_impl_data._M_start)->bias).m_data + lVar9);
    *puVar1 = CONCAT44(local_2b8._4_4_,local_2b8._0_4_);
    puVar1[1] = sStack_2b0;
    lVar9 = lVar9 + 0x24;
  }
  return;
}

Assistant:

Texture2DShader::Texture2DShader (const DataTypes& samplerTypes, glu::DataType outputType, const Vec4& outScale, const Vec4& outBias)
	: sglr::ShaderProgram	(genTexture2DShaderDecl(samplerTypes, outputType))
	, m_outScale			(outScale)
	, m_outBias				(outBias)
	, m_outputType			(outputType)
{
	m_inputs.resize(samplerTypes.vec.size());

	// Initialize units.
	for (int ndx = 0; ndx < (int)m_inputs.size(); ndx++)
	{
		m_inputs[ndx].unitNdx	= ndx;
		m_inputs[ndx].scale		= Vec4(1.0f);
		m_inputs[ndx].bias		= Vec4(0.0f);
	}
}